

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadModel(ParserImpl *this,ModelPtr *model,string *input)

{
  pointer *this_00;
  IssueImpl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  element_type *peVar4;
  size_t sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  element_type *peVar8;
  reference ppVar9;
  reference __t;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *p_Var10;
  __tuple_element_t<4UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *p_Var11;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *p_Var12;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *p_Var13;
  ulong uVar14;
  element_type *peVar15;
  element_type *peVar16;
  reference node_00;
  size_type sVar17;
  element_type *peVar18;
  XmlNodePtr *node_01;
  XmlNodePtr *extraout_RDX;
  XmlNodePtr *extraout_RDX_00;
  XmlNodePtr *node_02;
  XmlNodePtr *node_03;
  XmlNodePtr *node_04;
  undefined1 local_d60 [8];
  IssuePtr issue_13;
  pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  iterator __end1_1;
  iterator __begin1_1;
  DescriptionList *__range1_1;
  undefined1 local_d20 [8];
  DescriptionList issueList;
  shared_ptr<libcellml::XmlNode> *connectionNode;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  *__range1;
  NamePairList usedConnections;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  undefined1 local_c70 [8];
  IssuePtr issue_12;
  string local_c50;
  string local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  string local_b90;
  string local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  undefined1 local_ad0 [8];
  IssuePtr issue_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  undefined1 local_a20 [8];
  IssuePtr issue_10;
  string textNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  undefined1 local_990 [8];
  IssuePtr issue_9;
  XmlNodePtr componentRefNode;
  string local_960;
  string local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  undefined1 local_8a0 [8];
  IssuePtr issue_8;
  undefined1 local_870 [8];
  XmlAttributePtr childAttribute;
  undefined1 local_850 [8];
  ImportSourcePtr importSource;
  UnitsPtr units;
  ComponentPtr component;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  encapsulationNodes;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  connectionNodes;
  XmlNodePtr childNode;
  string local_7d8;
  undefined1 local_7b8 [8];
  IssuePtr issue_7;
  string local_798;
  string local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  string local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  undefined1 local_618 [8];
  IssuePtr issue_6;
  string local_5e8;
  undefined1 local_5c8 [8];
  XmlAttributePtr attribute;
  undefined1 local_5b0 [7];
  bool nameAttributePresent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_550 [8];
  IssuePtr issue_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  allocator<char> local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 local_458 [8];
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  string nodeNamespace;
  undefined1 local_398 [8];
  IssuePtr issue_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  IssuePtr issue_3;
  string uri_1;
  string attributeName;
  string nodeUri;
  string nodeName;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *e_1;
  iterator __end2_1;
  iterator __begin2_1;
  NodeAttributeNamespaceInfo *__range2_1;
  NodeAttributeNamespaceInfo attributeNamespaceMap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  IssuePtr issue_2;
  string uri;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *e;
  iterator __end2;
  iterator __begin2;
  XmlNamespaceMap *__range2;
  XmlNamespaceMap elementNamespaceMap;
  string local_d8;
  undefined1 local_b8 [8];
  IssuePtr issue_1;
  XmlNodePtr node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  IssuePtr issue;
  size_t i;
  undefined1 local_30 [8];
  XmlDocPtr doc;
  string *input_local;
  ModelPtr *model_local;
  ParserImpl *this_local;
  
  doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input;
  std::make_shared<libcellml::XmlDoc>();
  peVar4 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  XmlDoc::parse(peVar4,(string *)
                       doc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
  peVar4 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  sVar5 = XmlDoc::xmlErrorCount(peVar4);
  if (sVar5 != 0) {
    issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      _Var2._M_pi = issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar4 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)XmlDoc::xmlErrorCount(peVar4);
      if (p_Var6 <= _Var2._M_pi) break;
      Issue::IssueImpl::create();
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      pIVar1 = peVar7->mPimpl;
      peVar4 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      XmlDoc::xmlError_abi_cxx11_
                ((string *)
                 &node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,peVar4,
                 (size_t)issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      std::operator+(&local_78,"LibXml2 error: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      Issue::IssueImpl::setDescription(pIVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string
                ((string *)
                 &node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_58);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_58);
      issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
    }
  }
  std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  XmlDoc::rootNode((XmlDoc *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  bVar3 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (!bVar3) {
    Issue::IssueImpl::create();
    peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8);
    pIVar1 = peVar7->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Could not get a valid XML root node from the provided input.",
               (allocator<char> *)
               ((long)&elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    Issue::IssueImpl::setDescription(pIVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    bVar3 = Strict::isStrict(&this->mParser->super_Strict);
    if (bVar3) {
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML);
    }
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_b8);
    elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_b8);
    goto LAB_0032bddd;
  }
  peVar8 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar3 = XmlNode::isCellml20Element(peVar8,"model");
  this->mParsing20Version = bVar3;
  traverseTreeForElementNamespaces_abi_cxx11_
            ((XmlNamespaceMap *)&__range2,
             (libcellml *)
             &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             node_01);
  node_02 = extraout_RDX;
  if ((this->mParsing20Version & 1U) != 0) {
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range2);
    e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range2);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&e), node_02 = extraout_RDX_00, bVar3) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)(uri.field_2._M_local_buf + 8),(string *)ppVar9);
      std::__cxx11::string::string
                ((string *)
                 &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)&ppVar9->second);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &issue_2.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,"http://www.cellml.org/cellml/2.0#");
      if ((bVar3) &&
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issue_2.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,"http://www.w3.org/1998/Math/MathML"), bVar3)) {
        Issue::IssueImpl::create();
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_180);
        pIVar1 = peVar7->mPimpl;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &attributeNamespaceMap.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"Element \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&uri.field_2 + 8));
        std::operator+(&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &attributeNamespaceMap.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"\' uses namespace \'");
        std::operator+(&local_1c0,&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_1a0,&local_1c0,"\' which does not belong to an allowed namespace. ");
        Issue::IssueImpl::setDescription(pIVar1,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string
                  ((string *)
                   &attributeNamespaceMap.
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_180);
        Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML_UNEXPECTED_NAMESPACE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_180);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_180);
      }
      std::__cxx11::string::~string
                ((string *)
                 &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)(uri.field_2._M_local_buf + 8));
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  traverseTreeForAttributeNamespaces_abi_cxx11_
            ((NodeAttributeNamespaceInfo *)&__range2_1,
             (libcellml *)
             &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             node_02);
  if ((this->mParsing20Version & 1U) != 0) {
    __end2_1 = std::
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range2_1);
    e_1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range2_1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&e_1), bVar3) {
      __t = __gnu_cxx::
            __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end2_1);
      p_Var10 = std::
                get<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (__t);
      std::__cxx11::string::string((string *)(nodeUri.field_2._M_local_buf + 8),(string *)p_Var10);
      p_Var11 = std::
                get<4ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (__t);
      std::__cxx11::string::string
                ((string *)(attributeName.field_2._M_local_buf + 8),(string *)p_Var11);
      p_Var12 = std::
                get<1ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (__t);
      std::__cxx11::string::string((string *)(uri_1.field_2._M_local_buf + 8),(string *)p_Var12);
      p_Var13 = std::
                get<3ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (__t);
      std::__cxx11::string::string
                ((string *)
                 &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)p_Var13);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&nodeUri.field_2 + 8),"cn");
      if (((((!bVar3) ||
            (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&attributeName.field_2 + 8),
                                     "http://www.w3.org/1998/Math/MathML"), !bVar3)) ||
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&uri_1.field_2 + 8),"units"), !bVar3)) ||
          (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&issue_3.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,"http://www.cellml.org/cellml/2.0#"), !bVar3))
         && (((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&nodeUri.field_2 + 8),"import"), !bVar3 ||
              (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&attributeName.field_2 + 8),
                                       "http://www.cellml.org/cellml/2.0#"), !bVar3)) ||
             ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&uri_1.field_2 + 8),"href"), !bVar3 ||
              (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&issue_3.
                                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount,"http://www.w3.org/1999/xlink"), !bVar3)))))
         ) {
        Issue::IssueImpl::create();
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c8);
        pIVar1 = peVar7->mPimpl;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,"Element \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&nodeUri.field_2 + 8));
        std::operator+(&local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,"\' attribute \'");
        std::operator+(&local_348,&local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&uri_1.field_2 + 8));
        std::operator+(&local_328,&local_348,"\' has a namespace \'");
        std::operator+(&local_308,&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_2e8,&local_308,"\' specified.");
        Issue::IssueImpl::setDescription(pIVar1,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c8);
        Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML_ATTRIBUTE_HAS_NAMESPACE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_2c8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_2c8);
      }
      std::__cxx11::string::~string
                ((string *)
                 &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)(uri_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(attributeName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(nodeUri.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  bVar3 = Strict::isStrict(&this->mParser->super_Strict);
  if ((bVar3) && ((this->mParsing20Version & 1U) == 0)) {
LAB_003298c5:
    Issue::IssueImpl::create();
    peVar8 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&issue_1.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    XmlNode::name_abi_cxx11_((string *)((long)&nodeNamespace.field_2 + 8),peVar8);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&nodeNamespace.field_2 + 8),"model");
    std::__cxx11::string::~string((string *)(nodeNamespace.field_2._M_local_buf + 8));
    if (bVar3) {
      peVar8 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&issue_1.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      XmlNode::namespaceUri_abi_cxx11_((string *)local_3d8,peVar8);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_3d8,"null");
      }
      bVar3 = Strict::isStrict(&this->mParser->super_Strict);
      if (bVar3) {
        peVar8 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&issue_1.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        bVar3 = XmlNode::isCellml1XElement(peVar8,"model");
        if (!bVar3) goto LAB_00329afb;
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_398);
        pIVar1 = peVar7->mPimpl;
        nodesCellMl1XVersion_abi_cxx11_
                  ((string *)((long)&message.field_2 + 8),
                   (libcellml *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,node_03);
        std::operator+(&local_418,"Given model is a CellML ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&message.field_2 + 8));
        std::operator+(&local_3f8,&local_418," model but strict parsing mode is on.");
        Issue::IssueImpl::setDescription(pIVar1,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      }
      else {
LAB_00329afb:
        std::operator+(&local_478,"Model element is in an invalid namespace \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3d8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_458,&local_478,"\'.");
        std::__cxx11::string::~string((string *)&local_478);
        bVar3 = Strict::isStrict(&this->mParser->super_Strict);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d8,"http://www.cellml.org/cellml/2.0#",&local_4d9);
          std::operator+(&local_4b8," A valid CellML root node should be in the namespace \'",
                         &local_4d8);
          std::operator+(&local_498,&local_4b8,"\'.");
          std::__cxx11::string::operator+=((string *)local_458,(string *)&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::allocator<char>::~allocator(&local_4d9);
        }
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_398);
        Issue::IssueImpl::setDescription(peVar7->mPimpl,(string *)local_458);
        std::__cxx11::string::~string((string *)local_458);
      }
      std::__cxx11::string::~string((string *)local_3d8);
    }
    else {
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_398);
      pIVar1 = peVar7->mPimpl;
      peVar8 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&issue_1.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      XmlNode::name_abi_cxx11_
                ((string *)
                 &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,peVar8);
      std::operator+(&local_520,"Model element is of invalid type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_500,&local_520,
                     "\'. A valid CellML root node should be of type \'model\'.");
      Issue::IssueImpl::setDescription(pIVar1,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string
                ((string *)
                 &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_398);
    peVar15 = std::
              __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar7->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
    bVar3 = Strict::isStrict(&this->mParser->super_Strict);
    if (bVar3) {
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_398);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML_UNEXPECTED_ELEMENT);
    }
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_398);
    elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_398);
  }
  else {
    peVar8 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&issue_1.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    bVar3 = XmlNode::isCellmlElement(peVar8,"model");
    if (!bVar3) goto LAB_003298c5;
    peVar8 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&issue_1.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    bVar3 = XmlNode::isCellml1XElement(peVar8,"model");
    this->mParsing1XVersion = bVar3;
    if ((this->mParsing1XVersion & 1U) != 0) {
      Issue::IssueImpl::create();
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_550);
      pIVar1 = peVar7->mPimpl;
      nodesCellMl1XVersion_abi_cxx11_
                ((string *)local_5b0,
                 (libcellml *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,node_04);
      std::operator+(&local_590,"Given model is a CellML ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0)
      ;
      std::operator+(&local_570,&local_590,
                     " model, the parser will try to represent this model in CellML 2.0.");
      Issue::IssueImpl::setDescription(pIVar1,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)local_5b0);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_550);
      Issue::IssueImpl::setLevel(peVar7->mPimpl,MESSAGE);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_550);
      peVar15 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar7->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_550);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_550);
    }
    attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 0;
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    XmlNode::firstAttribute((XmlNode *)local_5c8);
    while (bVar3 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_5c8,(nullptr_t)0x0),
          bVar3) {
      peVar16 = std::
                __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_5c8);
      bVar3 = XmlAttribute::isType(peVar16,"name","");
      if (bVar3) {
        peVar18 = std::
                  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
        peVar16 = std::
                  __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_5c8);
        XmlAttribute::value_abi_cxx11_(&local_5e8,peVar16);
        NamedEntity::setName((NamedEntity *)peVar18,&local_5e8);
        std::__cxx11::string::~string((string *)&local_5e8);
        attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._7_1_ = 1;
      }
      else {
        bVar3 = isIdAttribute((XmlAttributePtr *)local_5c8,(bool)(this->mParsing1XVersion & 1));
        if (bVar3) {
          peVar18 = std::
                    __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)model);
          peVar16 = std::
                    __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_5c8);
          XmlAttribute::value_abi_cxx11_
                    ((string *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,peVar16);
          Entity::setId((Entity *)peVar18,
                        (string *)
                        &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          Issue::IssueImpl::create();
          if ((this->mParsing1XVersion & 1U) == 0) {
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_618);
            pIVar1 = peVar7->mPimpl;
            peVar8 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&issue_1.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            XmlNode::attribute_abi_cxx11_(&local_778,peVar8,"name");
            std::operator+(&local_758,"Model \'",&local_778);
            std::operator+(&local_738,&local_758,"\' has an invalid attribute \'");
            peVar16 = std::
                      __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_5c8);
            XmlAttribute::name_abi_cxx11_(&local_798,peVar16);
            std::operator+(&local_718,&local_738,&local_798);
            std::operator+(&local_6f8,&local_718,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_6f8);
            std::__cxx11::string::~string((string *)&local_6f8);
            std::__cxx11::string::~string((string *)&local_718);
            std::__cxx11::string::~string((string *)&local_798);
            std::__cxx11::string::~string((string *)&local_738);
            std::__cxx11::string::~string((string *)&local_758);
            std::__cxx11::string::~string((string *)&local_778);
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_618);
            Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,MODEL_ELEMENT);
          }
          else {
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_618);
            pIVar1 = peVar7->mPimpl;
            peVar8 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&issue_1.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            XmlNode::attribute_abi_cxx11_(&local_6b8,peVar8,"name");
            std::operator+(&local_698,"Model \'",&local_6b8);
            std::operator+(&local_678,&local_698,"\' ignoring attribute \'");
            peVar16 = std::
                      __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_5c8);
            XmlAttribute::name_abi_cxx11_(&local_6d8,peVar16);
            std::operator+(&local_658,&local_678,&local_6d8);
            std::operator+(&local_638,&local_658,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_638);
            std::__cxx11::string::~string((string *)&local_638);
            std::__cxx11::string::~string((string *)&local_658);
            std::__cxx11::string::~string((string *)&local_6d8);
            std::__cxx11::string::~string((string *)&local_678);
            std::__cxx11::string::~string((string *)&local_698);
            std::__cxx11::string::~string((string *)&local_6b8);
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_618);
            Issue::IssueImpl::setLevel(peVar7->mPimpl,MESSAGE);
          }
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_618);
          peVar15 = std::
                    __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&peVar7->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_618);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_618);
        }
      }
      std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_5c8);
      XmlAttribute::next((XmlAttribute *)
                         &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::shared_ptr<libcellml::XmlAttribute>::operator=
                ((shared_ptr<libcellml::XmlAttribute> *)local_5c8,
                 (shared_ptr<libcellml::XmlAttribute> *)
                 &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                ((shared_ptr<libcellml::XmlAttribute> *)
                 &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (((this->mParsing1XVersion & 1U) == 0) &&
       ((attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0)) {
      Issue::IssueImpl::create();
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b8);
      pIVar1 = peVar7->mPimpl;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d8,"Model does not have a name attribute.",
                 (allocator<char> *)
                 ((long)&childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      Issue::IssueImpl::setDescription(pIVar1,&local_7d8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b8);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,MODEL_NAME);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b8);
      peVar15 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar7->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_7b8);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_7b8);
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    XmlNode::firstChild((XmlNode *)
                        &connectionNodes.
                         super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
              *)&encapsulationNodes.
                 super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
              *)&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    while (bVar3 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                   &connectionNodes.
                                    super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (nullptr_t)0x0), bVar3) {
      bVar3 = parseNode(this,(XmlNodePtr *)
                             &connectionNodes.
                              super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"component");
      if (bVar3) {
        Component::create();
        loadComponent(this,(ComponentPtr *)
                           &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                      (XmlNodePtr *)
                      &connectionNodes.
                       super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        peVar18 = std::
                  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
        ComponentEntity::addComponent
                  (&peVar18->super_ComponentEntity,
                   (ComponentPtr *)
                   &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if ((this->mParsing1XVersion & 1U) != 0) {
          loadUnitsFromComponent
                    (this,model,
                     (XmlNodePtr *)
                     &connectionNodes.
                      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)
                   &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        bVar3 = parseNode(this,(XmlNodePtr *)
                               &connectionNodes.
                                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"units");
        if (bVar3) {
          Units::create();
          loadUnits(this,(UnitsPtr *)
                         &importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                    (XmlNodePtr *)
                    &connectionNodes.
                     super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          peVar18 = std::
                    __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)model);
          Model::addUnits(peVar18,(UnitsPtr *)
                                  &importSource.
                                   super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
          std::shared_ptr<libcellml::Units>::~shared_ptr
                    ((shared_ptr<libcellml::Units> *)
                     &importSource.
                      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          bVar3 = parseNode(this,(XmlNodePtr *)
                                 &connectionNodes.
                                  super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"import");
          if (bVar3) {
            ImportSource::create();
            loadImport(this,(ImportSourcePtr *)local_850,model,
                       (XmlNodePtr *)
                       &connectionNodes.
                        super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                      ((shared_ptr<libcellml::ImportSource> *)local_850);
          }
          else {
            peVar8 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&connectionNodes.
                                      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar3 = XmlNode::isCellml20Element(peVar8,"encapsulation");
            if (bVar3) {
              std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&connectionNodes.
                               super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              XmlNode::firstAttribute
                        ((XmlNode *)
                         &childAttribute.
                          super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              bVar3 = std::__shared_ptr::operator_cast_to_bool
                                ((__shared_ptr *)
                                 &childAttribute.
                                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
              std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                        ((shared_ptr<libcellml::XmlAttribute> *)
                         &childAttribute.
                          super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (bVar3) {
                std::
                __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&connectionNodes.
                               super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                XmlNode::firstAttribute((XmlNode *)local_870);
                while (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_870),
                      bVar3) {
                  bVar3 = isIdAttribute((XmlAttributePtr *)local_870,false);
                  if (bVar3) {
                    peVar18 = std::
                              __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)model);
                    peVar16 = std::
                              __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_870);
                    XmlAttribute::value_abi_cxx11_
                              ((string *)
                               &issue_8.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,peVar16);
                    ComponentEntity::setEncapsulationId
                              (&peVar18->super_ComponentEntity,
                               (string *)
                               &issue_8.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__cxx11::string::~string
                              ((string *)
                               &issue_8.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  else {
                    Issue::IssueImpl::create();
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_8a0);
                    pIVar1 = peVar7->mPimpl;
                    peVar18 = std::
                              __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)model);
                    NamedEntity::name_abi_cxx11_(&local_940,(NamedEntity *)peVar18);
                    std::operator+(&local_920,"Encapsulation in model \'",&local_940);
                    std::operator+(&local_900,&local_920,"\' has an invalid attribute \'");
                    peVar16 = std::
                              __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_870);
                    XmlAttribute::name_abi_cxx11_(&local_960,peVar16);
                    std::operator+(&local_8e0,&local_900,&local_960);
                    std::operator+(&local_8c0,&local_8e0,"\'.");
                    Issue::IssueImpl::setDescription(pIVar1,&local_8c0);
                    std::__cxx11::string::~string((string *)&local_8c0);
                    std::__cxx11::string::~string((string *)&local_8e0);
                    std::__cxx11::string::~string((string *)&local_960);
                    std::__cxx11::string::~string((string *)&local_900);
                    std::__cxx11::string::~string((string *)&local_920);
                    std::__cxx11::string::~string((string *)&local_940);
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_8a0);
                    peVar15 = std::
                              __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&peVar7->mPimpl->mItem);
                    AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar15->mPimpl,model);
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_8a0);
                    Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,ENCAPSULATION_ELEMENT);
                    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_8a0);
                    std::shared_ptr<libcellml::Issue>::~shared_ptr
                              ((shared_ptr<libcellml::Issue> *)local_8a0);
                  }
                  std::
                  __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_870);
                  XmlAttribute::next((XmlAttribute *)
                                     &componentRefNode.
                                      super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                  std::shared_ptr<libcellml::XmlAttribute>::operator=
                            ((shared_ptr<libcellml::XmlAttribute> *)local_870,
                             (shared_ptr<libcellml::XmlAttribute> *)
                             &componentRefNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                            ((shared_ptr<libcellml::XmlAttribute> *)
                             &componentRefNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                }
                std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                          ((shared_ptr<libcellml::XmlAttribute> *)local_870);
              }
              std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&connectionNodes.
                               super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              XmlNode::firstChild((XmlNode *)
                                  &issue_9.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
              bVar3 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                      &issue_9.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,(nullptr_t)0x0);
              if (bVar3) {
                std::
                vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                ::push_back((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                             *)&component.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,
                            (value_type *)
                            &connectionNodes.
                             super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                Issue::IssueImpl::create();
                peVar7 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_990);
                pIVar1 = peVar7->mPimpl;
                peVar18 = std::
                          __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)model);
                NamedEntity::name_abi_cxx11_
                          ((string *)((long)&textNode.field_2 + 8),(NamedEntity *)peVar18);
                std::operator+(&local_9d0,"Encapsulation in model \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&textNode.field_2 + 8));
                std::operator+(&local_9b0,&local_9d0,"\' does not contain any child elements.");
                Issue::IssueImpl::setDescription(pIVar1,&local_9b0);
                std::__cxx11::string::~string((string *)&local_9b0);
                std::__cxx11::string::~string((string *)&local_9d0);
                std::__cxx11::string::~string((string *)(textNode.field_2._M_local_buf + 8));
                peVar7 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_990);
                peVar15 = std::
                          __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&peVar7->mPimpl->mItem);
                AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar15->mPimpl,model);
                peVar7 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_990);
                Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,ENCAPSULATION_CHILD);
                peVar7 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_990);
                Issue::IssueImpl::setLevel(peVar7->mPimpl,WARNING);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_990);
                std::shared_ptr<libcellml::Issue>::~shared_ptr
                          ((shared_ptr<libcellml::Issue> *)local_990);
              }
              std::shared_ptr<libcellml::XmlNode>::~shared_ptr
                        ((shared_ptr<libcellml::XmlNode> *)
                         &issue_9.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              peVar8 = std::
                       __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&connectionNodes.
                                        super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = XmlNode::isCellml20Element(peVar8,"connection");
              if (bVar3) {
                std::
                vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                ::push_back((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                             *)&encapsulationNodes.
                                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)
                            &connectionNodes.
                             super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                peVar8 = std::
                         __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&connectionNodes.
                                          super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar3 = XmlNode::isText(peVar8);
                if (bVar3) {
                  peVar8 = std::
                           __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&connectionNodes.
                                            super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  XmlNode::convertToString_abi_cxx11_
                            ((string *)
                             &issue_10.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,peVar8);
                  bVar3 = hasNonWhitespaceCharacters
                                    ((string *)
                                     &issue_10.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                  if (bVar3) {
                    Issue::IssueImpl::create();
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_a20);
                    pIVar1 = peVar7->mPimpl;
                    peVar18 = std::
                              __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)model);
                    NamedEntity::name_abi_cxx11_
                              ((string *)
                               &issue_11.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(NamedEntity *)peVar18);
                    std::operator+(&local_aa0,"Model \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&issue_11.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                    std::operator+(&local_a80,&local_aa0,
                                   "\' has an invalid non-whitespace child text element \'");
                    std::operator+(&local_a60,&local_a80,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&issue_10.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                    std::operator+(&local_a40,&local_a60,"\'.");
                    Issue::IssueImpl::setDescription(pIVar1,&local_a40);
                    std::__cxx11::string::~string((string *)&local_a40);
                    std::__cxx11::string::~string((string *)&local_a60);
                    std::__cxx11::string::~string((string *)&local_a80);
                    std::__cxx11::string::~string((string *)&local_aa0);
                    std::__cxx11::string::~string
                              ((string *)
                               &issue_11.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_a20);
                    peVar15 = std::
                              __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&peVar7->mPimpl->mItem);
                    AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_a20);
                    Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML_UNEXPECTED_CHARACTER);
                    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_a20);
                    std::shared_ptr<libcellml::Issue>::~shared_ptr
                              ((shared_ptr<libcellml::Issue> *)local_a20);
                  }
                  std::__cxx11::string::~string
                            ((string *)
                             &issue_10.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                }
                else {
                  if ((this->mParsing1XVersion & 1U) != 0) {
                    peVar8 = std::
                             __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&connectionNodes.
                                              super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    bVar3 = XmlNode::isCellml1XElement(peVar8,"group");
                    if (bVar3) {
                      bVar3 = isEncapsulationRelationship
                                        ((XmlNodePtr *)
                                         &connectionNodes.
                                          super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (bVar3) {
                        std::
                        vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                        ::push_back((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                     *)&component.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,
                                    (value_type *)
                                    &connectionNodes.
                                     super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      goto LAB_0032b8db;
                    }
                  }
                  if ((this->mParsing1XVersion & 1U) != 0) {
                    peVar8 = std::
                             __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&connectionNodes.
                                              super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    bVar3 = XmlNode::isCellml1XElement(peVar8,"connection");
                    if (bVar3) {
                      std::
                      vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                      ::push_back((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                   *)&encapsulationNodes.
                                      super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (value_type *)
                                  &connectionNodes.
                                   super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      goto LAB_0032b8db;
                    }
                  }
                  peVar8 = std::
                           __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&connectionNodes.
                                            super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = XmlNode::isComment(peVar8);
                  if (!bVar3) {
                    Issue::IssueImpl::create();
                    if ((this->mParsing1XVersion & 1U) == 0) {
                      peVar7 = std::
                               __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_ad0);
                      pIVar1 = peVar7->mPimpl;
                      peVar18 = std::
                                __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)model);
                      NamedEntity::name_abi_cxx11_(&local_c30,(NamedEntity *)peVar18);
                      std::operator+(&local_c10,"Model \'",&local_c30);
                      std::operator+(&local_bf0,&local_c10,"\' has an invalid child element \'");
                      peVar8 = std::
                               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)&connectionNodes.
                                                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      XmlNode::name_abi_cxx11_(&local_c50,peVar8);
                      std::operator+(&local_bd0,&local_bf0,&local_c50);
                      std::operator+(&local_bb0,&local_bd0,"\'.");
                      Issue::IssueImpl::setDescription(pIVar1,&local_bb0);
                      std::__cxx11::string::~string((string *)&local_bb0);
                      std::__cxx11::string::~string((string *)&local_bd0);
                      std::__cxx11::string::~string((string *)&local_c50);
                      std::__cxx11::string::~string((string *)&local_bf0);
                      std::__cxx11::string::~string((string *)&local_c10);
                      std::__cxx11::string::~string((string *)&local_c30);
                      peVar7 = std::
                               __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_ad0);
                      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,XML_UNEXPECTED_ELEMENT);
                    }
                    else {
                      peVar7 = std::
                               __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_ad0);
                      pIVar1 = peVar7->mPimpl;
                      peVar18 = std::
                                __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)model);
                      NamedEntity::name_abi_cxx11_(&local_b70,(NamedEntity *)peVar18);
                      std::operator+(&local_b50,"Model \'",&local_b70);
                      std::operator+(&local_b30,&local_b50,"\' ignoring child element \'");
                      peVar8 = std::
                               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)&connectionNodes.
                                                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      XmlNode::name_abi_cxx11_(&local_b90,peVar8);
                      std::operator+(&local_b10,&local_b30,&local_b90);
                      std::operator+(&local_af0,&local_b10,"\'.");
                      Issue::IssueImpl::setDescription(pIVar1,&local_af0);
                      std::__cxx11::string::~string((string *)&local_af0);
                      std::__cxx11::string::~string((string *)&local_b10);
                      std::__cxx11::string::~string((string *)&local_b90);
                      std::__cxx11::string::~string((string *)&local_b30);
                      std::__cxx11::string::~string((string *)&local_b50);
                      std::__cxx11::string::~string((string *)&local_b70);
                      peVar7 = std::
                               __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_ad0);
                      Issue::IssueImpl::setLevel(peVar7->mPimpl,MESSAGE);
                    }
                    peVar7 = std::
                             __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_ad0);
                    peVar15 = std::
                              __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&peVar7->mPimpl->mItem);
                    AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar15->mPimpl,model,MODEL);
                    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_ad0);
                    std::shared_ptr<libcellml::Issue>::~shared_ptr
                              ((shared_ptr<libcellml::Issue> *)local_ad0);
                  }
                }
              }
            }
          }
        }
      }
LAB_0032b8db:
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&connectionNodes.
                     super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      XmlNode::next((XmlNode *)
                    &issue_12.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      std::shared_ptr<libcellml::XmlNode>::operator=
                ((shared_ptr<libcellml::XmlNode> *)
                 &connectionNodes.
                  super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (shared_ptr<libcellml::XmlNode> *)
                 &issue_12.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr
                ((shared_ptr<libcellml::XmlNode> *)
                 &issue_12.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    bVar3 = std::
            vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
            ::empty((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     *)&component.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (!bVar3) {
      node_00 = std::
                vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                ::at((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                      *)&component.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,0);
      loadEncapsulation(this,model,node_00);
      sVar17 = std::
               vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               ::size((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                       *)&component.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (1 < sVar17) {
        Issue::IssueImpl::create();
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c70);
        pIVar1 = peVar7->mPimpl;
        peVar18 = std::
                  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
        NamedEntity::name_abi_cxx11_
                  ((string *)
                   &usedConnections.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(NamedEntity *)peVar18);
        std::operator+(&local_cb0,"Model \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &usedConnections.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_c90,&local_cb0,"\' has more than one encapsulation element.");
        Issue::IssueImpl::setDescription(pIVar1,&local_c90);
        std::__cxx11::string::~string((string *)&local_c90);
        std::__cxx11::string::~string((string *)&local_cb0);
        std::__cxx11::string::~string
                  ((string *)
                   &usedConnections.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c70);
        peVar15 = std::
                  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar7->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar15->mPimpl,model);
        peVar7 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c70);
        Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,MODEL_MORE_THAN_ONE_ENCAPSULATION);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_c70);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_c70);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1);
    this_00 = &encapsulationNodes.
               super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1 = std::
             vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
             ::begin((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                      *)this_00);
    connectionNode =
         (shared_ptr<libcellml::XmlNode> *)
         std::
         vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
         ::end((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<libcellml::XmlNode>_*,_std::vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>_>
                                       *)&connectionNode), bVar3) {
      issueList.
      super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<libcellml::XmlNode>_*,_std::vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>_>
                    ::operator*(&__end1);
      loadConnection(this,model,
                     (XmlNodePtr *)
                     issueList.
                     super__Vector_base<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(NamePairList *)&__range1);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::XmlNode>_*,_std::vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_d20);
    std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Model,void>
              ((shared_ptr<libcellml::ComponentEntity> *)&__range1_1,model);
    traverseComponentEntityTreeLinkingUnits
              ((shared_ptr<libcellml::ComponentEntity> *)&__range1_1,
               (vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_d20);
    std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr
              ((shared_ptr<libcellml::ComponentEntity> *)&__range1_1);
    __end1_1 = std::
               vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_d20);
    entry = (pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_d20);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&entry), bVar3) {
      issue_13.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&__end1_1);
      Issue::IssueImpl::create();
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d60);
      Issue::IssueImpl::setDescription
                (peVar7->mPimpl,
                 (string *)
                 (issue_13.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 1));
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d60);
      Issue::IssueImpl::setLevel(peVar7->mPimpl,WARNING);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d60);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,VARIABLE_ELEMENT);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d60);
      peVar15 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar7->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable
                (peVar15->mPimpl,
                 (VariablePtr *)
                 issue_13.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_d60);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_d60);
      __gnu_cxx::
      __normal_iterator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_1);
    }
    std::
    vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d20);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range1);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               *)&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               *)&encapsulationNodes.
                  super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr
              ((shared_ptr<libcellml::XmlNode> *)
               &connectionNodes.
                super__Vector_base<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)local_5c8);
    elementNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range2_1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range2);
LAB_0032bddd:
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::XmlDoc>::~shared_ptr((shared_ptr<libcellml::XmlDoc> *)local_30);
  return;
}

Assistant:

void Parser::ParserImpl::loadModel(const ModelPtr &model, const std::string &input)
{
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(input);
    // Copy any XML parsing issues into the common parser issue handler.
    if (doc->xmlErrorCount() > 0) {
        for (size_t i = 0; i < doc->xmlErrorCount(); ++i) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("LibXml2 error: " + doc->xmlError(i));
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
            addIssue(issue);
        }
    }
    const XmlNodePtr node = doc->rootNode();
    if (!node) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Could not get a valid XML root node from the provided input.");
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        }
        addIssue(issue);
        return;
    }

    mParsing20Version = node->isCellml20Element("model");

    auto elementNamespaceMap = traverseTreeForElementNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : elementNamespaceMap) {
            std::string name = e.first;
            std::string uri = e.second;
            if ((uri != CELLML_2_0_NS) && (uri != MATHML_NS)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + name + "' uses namespace '" + uri + "' which does not belong to an allowed namespace. ");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    auto attributeNamespaceMap = traverseTreeForAttributeNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : attributeNamespaceMap) {
            std::string nodeName = std::get<0>(e);
            std::string nodeUri = std::get<4>(e);
            std::string attributeName = std::get<1>(e);
            std::string uri = std::get<3>(e);
            if ((nodeName == "cn") && (nodeUri == MATHML_NS) && (attributeName == "units") && (uri == CELLML_2_0_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else if ((nodeName == "import") && (nodeUri == CELLML_2_0_NS) && (attributeName == "href") && (uri == XLINK_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + nodeName + "' attribute '" + attributeName + "' has a namespace '" + uri + "' specified.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ATTRIBUTE_HAS_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    if ((mParser->isStrict() && !mParsing20Version) || !node->isCellmlElement("model")) {
        auto issue = Issue::IssueImpl::create();
        if (node->name() == "model") {
            std::string nodeNamespace = node->namespaceUri();
            if (nodeNamespace.empty()) {
                nodeNamespace = "null";
            }
            if (mParser->isStrict() && node->isCellml1XElement("model")) {
                issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model but strict parsing mode is on.");
            } else {
                std::string message = "Model element is in an invalid namespace '" + nodeNamespace + "'.";
                if (mParser->isStrict()) {
                    message += " A valid CellML root node should be in the namespace '" + std::string(CELLML_2_0_NS) + "'.";
                }
                issue->mPimpl->setDescription(message);
            }
        } else {
            issue->mPimpl->setDescription("Model element is of invalid type '" + node->name() + "'. A valid CellML root node should be of type 'model'.");
        }
        issue->mPimpl->mItem->mPimpl->setModel(model);
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
        }
        addIssue(issue);
        return;
    }
    mParsing1XVersion = node->isCellml1XElement("model");
    if (mParsing1XVersion) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model, the parser will try to represent this model in CellML 2.0.");
        issue->mPimpl->setLevel(Issue::Level::MESSAGE);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }
    // Get model attributes.
    bool nameAttributePresent = false;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            model->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            model->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!mParsing1XVersion && !nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model does not have a name attribute.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_NAME);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }

    // Get model children (CellML entities).
    XmlNodePtr childNode = node->firstChild();
    std::vector<XmlNodePtr> connectionNodes;
    std::vector<XmlNodePtr> encapsulationNodes;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            auto component = Component::create();
            loadComponent(component, childNode);
            model->addComponent(component);
            if (mParsing1XVersion) {
                loadUnitsFromComponent(model, childNode);
            }
        } else if (parseNode(childNode, "units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        } else if (parseNode(childNode, "import")) {
            ImportSourcePtr importSource = ImportSource::create();
            loadImport(importSource, model, childNode);
        } else if (childNode->isCellml20Element("encapsulation")) {
            // An encapsulation should not have attributes other than an 'id' attribute.
            if (childNode->firstAttribute()) {
                XmlAttributePtr childAttribute = childNode->firstAttribute();
                while (childAttribute) {
                    if (isIdAttribute(childAttribute, false)) {
                        model->setEncapsulationId(childAttribute->value());
                    } else {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid attribute '" + childAttribute->name() + "'.");
                        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_ELEMENT);
                        addIssue(issue);
                    }
                    childAttribute = childAttribute->next();
                }
            }
            // Load encapsulated component_refs.
            XmlNodePtr componentRefNode = childNode->firstChild();
            if (componentRefNode != nullptr) {
                // This component_ref and its child and sibling elements will be loaded
                // and issue-checked in loadEncapsulation().
                encapsulationNodes.push_back(childNode);
            } else {
                // Empty encapsulations are valid, but may not be intended.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not contain any child elements.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
                addIssue(issue);
            }
        } else if (childNode->isCellml20Element("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("group")) {
            if (isEncapsulationRelationship(childNode)) {
                encapsulationNodes.push_back(childNode);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + model->name() + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    if (!encapsulationNodes.empty()) {
        loadEncapsulation(model, encapsulationNodes.at(0));
        if (encapsulationNodes.size() > 1) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Model '" + model->name() + "' has more than one encapsulation element.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_MORE_THAN_ONE_ENCAPSULATION);
            addIssue(issue);
        }
    }

    NamePairList usedConnections;
    for (const auto &connectionNode : connectionNodes) {
        loadConnection(model, connectionNode, usedConnections);
    }

    // Link units to their names.
    DescriptionList issueList;
    traverseComponentEntityTreeLinkingUnits(model, issueList);
    for (const auto &entry : issueList) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(entry.second);
        issue->mPimpl->setLevel(Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ELEMENT);
        issue->mPimpl->mItem->mPimpl->setVariable(entry.first);
        addIssue(issue);
    }
}